

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

void __thiscall wabt::TypeChecker::PrintError(TypeChecker *this,char *fmt,...)

{
  _Invoker_type p_Var1;
  long lVar2;
  int iVar3;
  size_t __maxlen;
  char *__s;
  undefined8 uStack_1a0;
  char local_198 [8];
  char fixed_buf [128];
  undefined8 local_68;
  va_list args;
  undefined8 local_48;
  va_list args_copy;
  char *local_28;
  
  if ((this->error_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_68 = 0x3000000010;
    args[0]._0_8_ = &stack0x00000008;
    args[0].overflow_arg_area = fixed_buf + 0x78;
    local_48 = 0x3000000010;
    __s = local_198;
    uStack_1a0 = 0x14e311;
    args_copy[0]._0_8_ = args[0]._0_8_;
    args_copy[0].overflow_arg_area = args[0].overflow_arg_area;
    iVar3 = vsnprintf(__s,0x80,fmt,&local_68);
    __maxlen = (long)iVar3 + 1;
    if (0x80 < __maxlen) {
      lVar2 = -((long)iVar3 + 0x10U & 0xfffffffffffffff0);
      __s = local_198 + lVar2;
      *(undefined8 *)((long)&uStack_1a0 + lVar2) = 0x14e340;
      vsnprintf(__s,__maxlen,fmt,&local_48);
    }
    local_28 = __s;
    if ((this->error_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      __s[-8] = 'e';
      __s[-7] = -0x1d;
      __s[-6] = '\x14';
      __s[-5] = '\0';
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      std::__throw_bad_function_call();
    }
    p_Var1 = (this->error_callback_)._M_invoker;
    __s[-8] = 'U';
    __s[-7] = -0x1d;
    __s[-6] = '\x14';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    (*p_Var1)((_Any_data *)this,&local_28);
  }
  return;
}

Assistant:

void TypeChecker::PrintError(const char* fmt, ...) {
  if (error_callback_) {
    WABT_SNPRINTF_ALLOCA(buffer, length, fmt);
    error_callback_(buffer);
  }
}